

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall despot::VNode::Free(VNode *this,DSPOMDP *model)

{
  pointer ppSVar1;
  pointer ppQVar2;
  QNode *pQVar3;
  _Base_ptr p_Var4;
  int a;
  int i;
  ulong uVar5;
  
  uVar5 = 0;
  while( true ) {
    ppSVar1 = (this->particles_).
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->particles_).
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar5) break;
    (*model->_vptr_DSPOMDP[0x17])(model,ppSVar1[uVar5]);
    uVar5 = uVar5 + 1;
  }
  for (uVar5 = 0;
      ppQVar2 = (this->children_).
                super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->children_).
                            super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppQVar2 >> 3);
      uVar5 = uVar5 + 1) {
    pQVar3 = ppQVar2[uVar5];
    for (p_Var4 = (pQVar3->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pQVar3->children_)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      Free((VNode *)p_Var4[1]._M_parent,model);
    }
  }
  return;
}

Assistant:

void VNode::Free(const DSPOMDP& model) {
	for (int i = 0; i < particles_.size(); i++) {
		model.Free(particles_[i]);
	}

	for (int a = 0; a < children().size(); a++) {
		QNode* qnode = Child(a);
		map<OBS_TYPE, VNode*>& children = qnode->children();
		for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
			it != children.end(); it++) {
			it->second->Free(model);
		}
	}
}